

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O0

string * banksia::getFileName(string *path)

{
  string *in_RSI;
  string *in_RDI;
  size_type pos;
  string *str;
  string local_40 [39];
  undefined1 local_19;
  long local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::find_last_of((char *)in_RSI,0x214a0a);
  local_19 = 0;
  if (local_18 == -1) {
    std::__cxx11::string::string((string *)in_RDI,local_10);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
  }
  local_18 = std::__cxx11::string::find_last_of((char *)in_RDI,0x1ff730);
  if (local_18 != -1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)in_RDI);
    std::__cxx11::string::operator=((string *)in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return in_RDI;
}

Assistant:

std::string getFileName(const std::string& path) {
        auto pos = path.find_last_of("/\\");
        std::string str = pos != std::string::npos ? path.substr(pos + 1) : path;
        pos = str.find_last_of(".");
        if (pos != std::string::npos) {
            str = str.substr(0, pos);
        }
        return str;
    }